

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_taskdeps.cpp
# Opt level: O0

kmp_int32 __kmp_process_deps<false>
                    (kmp_int32 gtid,kmp_depnode_t *node,kmp_dephash_t *hash,bool dep_barrier,
                    kmp_int32 ndeps,kmp_depend_info_t *dep_list,kmp_task_t *task)

{
  kmp_int32 kVar1;
  kmp_task_t *task_00;
  kmp_info_t *thread_00;
  kmp_depnode_t *pkVar2;
  kmp_depnode_list_t *pkVar3;
  void *pvVar4;
  byte in_CL;
  kmp_depnode_t *in_RSI;
  int in_EDI;
  int in_R8D;
  long in_R9;
  int n;
  kmp_int32 m;
  kmp_depnode_list_t *last_mtxs;
  kmp_depnode_list_t *last_ins;
  kmp_depnode_t *last_out;
  kmp_dephash_entry_t *info;
  kmp_depend_info_t *dep;
  kmp_int32 i;
  kmp_int32 npredecessors;
  kmp_info_t *thread;
  kmp_int32 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  kmp_info_t *in_stack_ffffffffffffffa0;
  kmp_depnode_t *in_stack_ffffffffffffffa8;
  kmp_info_t *in_stack_ffffffffffffffb0;
  int iVar5;
  int iVar6;
  kmp_int32 gtid_00;
  kmp_info_t *pkVar7;
  
  pkVar7 = __kmp_threads[in_EDI];
  iVar6 = 0;
  iVar5 = 0;
  do {
    if (in_R8D <= iVar5) {
      return iVar6;
    }
    task_00 = (kmp_task_t *)(in_R9 + (long)iVar5 * 0x18);
    thread_00 = (kmp_info_t *)
                __kmp_dephash_find(in_stack_ffffffffffffffb0,
                                   (kmp_dephash_t *)&in_stack_ffffffffffffffa8->dn,
                                   (kmp_intptr_t)in_stack_ffffffffffffffa0);
    in_stack_ffffffffffffffb0 = *(kmp_info_t **)(thread_00->th_pad + 8);
    in_stack_ffffffffffffffa8 = *(kmp_depnode_t **)(thread_00->th_pad + 0x10);
    in_stack_ffffffffffffffa0 = *(kmp_info_t **)(thread_00->th_pad + 0x18);
    gtid_00 = (kmp_int32)pkVar7;
    kVar1 = (kmp_int32)task_00;
    if (((byte)task_00->part_id >> 1 & 1) == 0) {
      if ((task_00->part_id & 1) == 0) {
        if (in_stack_ffffffffffffffa8 == (kmp_depnode_t *)0x0) {
          kVar1 = __kmp_depnode_link_successor
                            (kVar1,thread_00,(kmp_task_t *)&in_stack_ffffffffffffffb0->th,
                             (kmp_depnode_t *)0x0,(kmp_depnode_t *)in_stack_ffffffffffffffa0);
          iVar6 = kVar1 + iVar6;
        }
        else {
          kVar1 = __kmp_depnode_link_successor
                            (gtid_00,(kmp_info_t *)CONCAT44(iVar6,iVar5),task_00,
                             (kmp_depnode_t *)thread_00,
                             (kmp_depnode_list_t *)&in_stack_ffffffffffffffb0->th);
          iVar6 = kVar1 + iVar6;
          __kmp_node_deref(thread_00,(kmp_depnode_t *)in_stack_ffffffffffffffb0);
          *(char *)((long)thread_00 + 8) = '\0';
          *(char *)((long)thread_00 + 9) = '\0';
          *(char *)((long)thread_00 + 10) = '\0';
          *(char *)((long)thread_00 + 0xb) = '\0';
          *(char *)((long)thread_00 + 0xc) = '\0';
          *(char *)((long)thread_00 + 0xd) = '\0';
          *(char *)((long)thread_00 + 0xe) = '\0';
          *(char *)((long)thread_00 + 0xf) = '\0';
          if ((*(int *)(thread_00->th_pad + 0x20) == 0) &&
             (in_stack_ffffffffffffffa0 != (kmp_info_t *)0x0)) {
            __kmp_depnode_list_free
                      (in_stack_ffffffffffffffa0,
                       (kmp_depnode_list *)
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
            *(char *)((long)thread_00 + 0x18) = '\0';
            *(char *)((long)thread_00 + 0x19) = '\0';
            *(char *)((long)thread_00 + 0x1a) = '\0';
            *(char *)((long)thread_00 + 0x1b) = '\0';
            *(char *)((long)thread_00 + 0x1c) = '\0';
            *(char *)((long)thread_00 + 0x1d) = '\0';
            *(char *)((long)thread_00 + 0x1e) = '\0';
            *(char *)((long)thread_00 + 0x1f) = '\0';
          }
        }
        *(char *)((long)thread_00 + 0x20) = '\x01';
        *(char *)((long)thread_00 + 0x21) = '\0';
        *(char *)((long)thread_00 + 0x22) = '\0';
        *(char *)((long)thread_00 + 0x23) = '\0';
        pkVar3 = __kmp_add_node(in_stack_ffffffffffffffb0,
                                (kmp_depnode_list_t *)&in_stack_ffffffffffffffa8->dn,
                                (kmp_depnode_t *)in_stack_ffffffffffffffa0);
        *(kmp_depnode_list_t **)(thread_00->th_pad + 0x18) = pkVar3;
        if (*(long *)(thread_00->th_pad + 0x28) == 0) {
          pvVar4 = ___kmp_allocate((size_t)in_stack_ffffffffffffffa0);
          *(void **)(thread_00->th_pad + 0x28) = pvVar4;
          __kmp_init_lock((kmp_lock_t *)0x1c8a8e);
        }
        in_stack_ffffffffffffff9c = 0;
LAB_001c8a96:
        if (in_stack_ffffffffffffff9c < 4) {
          if (*(ulong *)(thread_00->th_pad + 0x28) <=
              *(ulong *)((long)in_RSI + (long)in_stack_ffffffffffffff9c * 8 + 0x10)) break;
          for (in_stack_ffffffffffffff98 = (in_RSI->dn).mtx_num_locks;
              in_stack_ffffffffffffff9c < in_stack_ffffffffffffff98;
              in_stack_ffffffffffffff98 = in_stack_ffffffffffffff98 + -1) {
            *(undefined8 *)((long)in_RSI + (long)in_stack_ffffffffffffff98 * 8 + 0x10) =
                 *(undefined8 *)((long)in_RSI + (long)(in_stack_ffffffffffffff98 + -1) * 8 + 0x10);
          }
          *(undefined8 *)((long)in_RSI + (long)in_stack_ffffffffffffff9c * 8 + 0x10) =
               *(undefined8 *)(thread_00->th_pad + 0x28);
        }
        (in_RSI->dn).mtx_num_locks = (in_RSI->dn).mtx_num_locks + 1;
        goto LAB_001c8b37;
      }
      if (in_stack_ffffffffffffffa0 == (kmp_info_t *)0x0) {
        kVar1 = __kmp_depnode_link_successor
                          (kVar1,thread_00,(kmp_task_t *)&in_stack_ffffffffffffffb0->th,
                           in_stack_ffffffffffffffa8,(kmp_depnode_t *)0x0);
        iVar6 = kVar1 + iVar6;
      }
      else {
        kVar1 = __kmp_depnode_link_successor
                          (gtid_00,(kmp_info_t *)CONCAT44(iVar6,iVar5),task_00,
                           (kmp_depnode_t *)thread_00,
                           (kmp_depnode_list_t *)&in_stack_ffffffffffffffb0->th);
        iVar6 = kVar1 + iVar6;
        __kmp_node_deref(thread_00,(kmp_depnode_t *)in_stack_ffffffffffffffb0);
        *(char *)((long)thread_00 + 8) = '\0';
        *(char *)((long)thread_00 + 9) = '\0';
        *(char *)((long)thread_00 + 10) = '\0';
        *(char *)((long)thread_00 + 0xb) = '\0';
        *(char *)((long)thread_00 + 0xc) = '\0';
        *(char *)((long)thread_00 + 0xd) = '\0';
        *(char *)((long)thread_00 + 0xe) = '\0';
        *(char *)((long)thread_00 + 0xf) = '\0';
        if ((*(int *)(thread_00->th_pad + 0x20) == 1) &&
           (in_stack_ffffffffffffffa8 != (kmp_depnode_t *)0x0)) {
          __kmp_depnode_list_free
                    (in_stack_ffffffffffffffa0,
                     (kmp_depnode_list *)
                     CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
          *(char *)((long)thread_00 + 0x10) = '\0';
          *(char *)((long)thread_00 + 0x11) = '\0';
          *(char *)((long)thread_00 + 0x12) = '\0';
          *(char *)((long)thread_00 + 0x13) = '\0';
          *(char *)((long)thread_00 + 0x14) = '\0';
          *(char *)((long)thread_00 + 0x15) = '\0';
          *(char *)((long)thread_00 + 0x16) = '\0';
          *(char *)((long)thread_00 + 0x17) = '\0';
        }
      }
      *(char *)((long)thread_00 + 0x20) = '\0';
      *(char *)((long)thread_00 + 0x21) = '\0';
      *(char *)((long)thread_00 + 0x22) = '\0';
      *(char *)((long)thread_00 + 0x23) = '\0';
      pkVar3 = __kmp_add_node(in_stack_ffffffffffffffb0,
                              (kmp_depnode_list_t *)&in_stack_ffffffffffffffa8->dn,
                              (kmp_depnode_t *)in_stack_ffffffffffffffa0);
      *(kmp_depnode_list_t **)(thread_00->th_pad + 0x10) = pkVar3;
    }
    else {
      if ((in_stack_ffffffffffffffa8 == (kmp_depnode_t *)0x0) &&
         (in_stack_ffffffffffffffa0 == (kmp_info_t *)0x0)) {
        kVar1 = __kmp_depnode_link_successor
                          (kVar1,thread_00,(kmp_task_t *)&in_stack_ffffffffffffffb0->th,
                           (kmp_depnode_t *)0x0,(kmp_depnode_t *)0x0);
        iVar6 = kVar1 + iVar6;
      }
      else {
        if (*(int *)(thread_00->th_pad + 0x20) == 0) {
          kVar1 = __kmp_depnode_link_successor
                            (gtid_00,(kmp_info_t *)CONCAT44(iVar6,iVar5),task_00,
                             (kmp_depnode_t *)thread_00,
                             (kmp_depnode_list_t *)&in_stack_ffffffffffffffb0->th);
          iVar6 = kVar1 + iVar6;
        }
        else {
          kVar1 = __kmp_depnode_link_successor
                            (gtid_00,(kmp_info_t *)CONCAT44(iVar6,iVar5),task_00,
                             (kmp_depnode_t *)thread_00,
                             (kmp_depnode_list_t *)&in_stack_ffffffffffffffb0->th);
          iVar6 = kVar1 + iVar6;
        }
        __kmp_depnode_list_free
                  (in_stack_ffffffffffffffa0,
                   (kmp_depnode_list *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                  );
        __kmp_depnode_list_free
                  (in_stack_ffffffffffffffa0,
                   (kmp_depnode_list *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                  );
        *(char *)((long)thread_00 + 0x10) = '\0';
        *(char *)((long)thread_00 + 0x11) = '\0';
        *(char *)((long)thread_00 + 0x12) = '\0';
        *(char *)((long)thread_00 + 0x13) = '\0';
        *(char *)((long)thread_00 + 0x14) = '\0';
        *(char *)((long)thread_00 + 0x15) = '\0';
        *(char *)((long)thread_00 + 0x16) = '\0';
        *(char *)((long)thread_00 + 0x17) = '\0';
        *(char *)((long)thread_00 + 0x18) = '\0';
        *(char *)((long)thread_00 + 0x19) = '\0';
        *(char *)((long)thread_00 + 0x1a) = '\0';
        *(char *)((long)thread_00 + 0x1b) = '\0';
        *(char *)((long)thread_00 + 0x1c) = '\0';
        *(char *)((long)thread_00 + 0x1d) = '\0';
        *(char *)((long)thread_00 + 0x1e) = '\0';
        *(char *)((long)thread_00 + 0x1f) = '\0';
      }
      __kmp_node_deref(thread_00,(kmp_depnode_t *)in_stack_ffffffffffffffb0);
      if ((in_CL & 1) == 0) {
        pkVar2 = __kmp_node_ref(in_RSI);
        *(kmp_depnode_t **)(thread_00->th_pad + 8) = pkVar2;
      }
      else {
        *(char *)((long)thread_00 + 8) = '\0';
        *(char *)((long)thread_00 + 9) = '\0';
        *(char *)((long)thread_00 + 10) = '\0';
        *(char *)((long)thread_00 + 0xb) = '\0';
        *(char *)((long)thread_00 + 0xc) = '\0';
        *(char *)((long)thread_00 + 0xd) = '\0';
        *(char *)((long)thread_00 + 0xe) = '\0';
        *(char *)((long)thread_00 + 0xf) = '\0';
      }
    }
LAB_001c8b37:
    iVar5 = iVar5 + 1;
  } while( true );
  in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c + 1;
  goto LAB_001c8a96;
}

Assistant:

static inline kmp_int32
__kmp_process_deps(kmp_int32 gtid, kmp_depnode_t *node, kmp_dephash_t *hash,
                   bool dep_barrier, kmp_int32 ndeps,
                   kmp_depend_info_t *dep_list, kmp_task_t *task) {
  KA_TRACE(30, ("__kmp_process_deps<%d>: T#%d processing %d dependencies : "
                "dep_barrier = %d\n",
                filter, gtid, ndeps, dep_barrier));

  kmp_info_t *thread = __kmp_threads[gtid];
  kmp_int32 npredecessors = 0;
  for (kmp_int32 i = 0; i < ndeps; i++) {
    const kmp_depend_info_t *dep = &dep_list[i];

    if (filter && dep->base_addr == 0)
      continue; // skip filtered entries

    kmp_dephash_entry_t *info =
        __kmp_dephash_find(thread, hash, dep->base_addr);
    kmp_depnode_t *last_out = info->last_out;
    kmp_depnode_list_t *last_ins = info->last_ins;
    kmp_depnode_list_t *last_mtxs = info->last_mtxs;

    if (dep->flags.out) { // out --> clean lists of ins and mtxs if any
      if (last_ins || last_mtxs) {
        if (info->last_flag == ENTRY_LAST_INS) { // INS were last
          npredecessors +=
              __kmp_depnode_link_successor(gtid, thread, task, node, last_ins);
        } else { // MTXS were last
          npredecessors +=
              __kmp_depnode_link_successor(gtid, thread, task, node, last_mtxs);
        }
        __kmp_depnode_list_free(thread, last_ins);
        __kmp_depnode_list_free(thread, last_mtxs);
        info->last_ins = NULL;
        info->last_mtxs = NULL;
      } else {
        npredecessors +=
            __kmp_depnode_link_successor(gtid, thread, task, node, last_out);
      }
      __kmp_node_deref(thread, last_out);
      if (dep_barrier) {
        // if this is a sync point in the serial sequence, then the previous
        // outputs are guaranteed to be completed after the execution of this
        // task so the previous output nodes can be cleared.
        info->last_out = NULL;
      } else {
        info->last_out = __kmp_node_ref(node);
      }
    } else if (dep->flags.in) {
      // in --> link node to either last_out or last_mtxs, clean earlier deps
      if (last_mtxs) {
        npredecessors +=
            __kmp_depnode_link_successor(gtid, thread, task, node, last_mtxs);
        __kmp_node_deref(thread, last_out);
        info->last_out = NULL;
        if (info->last_flag == ENTRY_LAST_MTXS && last_ins) { // MTXS were last
          // clean old INS before creating new list
          __kmp_depnode_list_free(thread, last_ins);
          info->last_ins = NULL;
        }
      } else {
        // link node as successor of the last_out if any
        npredecessors +=
            __kmp_depnode_link_successor(gtid, thread, task, node, last_out);
      }
      info->last_flag = ENTRY_LAST_INS;
      info->last_ins = __kmp_add_node(thread, info->last_ins, node);
    } else {
      KMP_DEBUG_ASSERT(dep->flags.mtx == 1);
      // mtx --> link node to either last_out or last_ins, clean earlier deps
      if (last_ins) {
        npredecessors +=
            __kmp_depnode_link_successor(gtid, thread, task, node, last_ins);
        __kmp_node_deref(thread, last_out);
        info->last_out = NULL;
        if (info->last_flag == ENTRY_LAST_INS && last_mtxs) { // INS were last
          // clean old MTXS before creating new list
          __kmp_depnode_list_free(thread, last_mtxs);
          info->last_mtxs = NULL;
        }
      } else {
        // link node as successor of the last_out if any
        npredecessors +=
            __kmp_depnode_link_successor(gtid, thread, task, node, last_out);
      }
      info->last_flag = ENTRY_LAST_MTXS;
      info->last_mtxs = __kmp_add_node(thread, info->last_mtxs, node);
      if (info->mtx_lock == NULL) {
        info->mtx_lock = (kmp_lock_t *)__kmp_allocate(sizeof(kmp_lock_t));
        __kmp_init_lock(info->mtx_lock);
      }
      KMP_DEBUG_ASSERT(node->dn.mtx_num_locks < MAX_MTX_DEPS);
      kmp_int32 m;
      // Save lock in node's array
      for (m = 0; m < MAX_MTX_DEPS; ++m) {
        // sort pointers in decreasing order to avoid potential livelock
        if (node->dn.mtx_locks[m] < info->mtx_lock) {
          KMP_DEBUG_ASSERT(node->dn.mtx_locks[node->dn.mtx_num_locks] == NULL);
          for (int n = node->dn.mtx_num_locks; n > m; --n) {
            // shift right all lesser non-NULL pointers
            KMP_DEBUG_ASSERT(node->dn.mtx_locks[n - 1] != NULL);
            node->dn.mtx_locks[n] = node->dn.mtx_locks[n - 1];
          }
          node->dn.mtx_locks[m] = info->mtx_lock;
          break;
        }
      }
      KMP_DEBUG_ASSERT(m < MAX_MTX_DEPS); // must break from loop
      node->dn.mtx_num_locks++;
    }
  }
  KA_TRACE(30, ("__kmp_process_deps<%d>: T#%d found %d predecessors\n", filter,
                gtid, npredecessors));
  return npredecessors;
}